

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMarkers.cpp
# Opt level: O2

void __thiscall chrono::ChLinkMarkers::ArchiveOUT(ChLinkMarkers *this,ChArchiveOut *marchive)

{
  ChNameValue<int> local_48;
  ChNameValue<int> local_30;
  
  ChArchiveOut::VersionWrite<chrono::ChLinkMarkers>(marchive);
  ChLink::ArchiveOUT(&this->super_ChLink,marchive);
  local_30._value = &this->markID1;
  local_30._name = "markID1";
  local_30._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_30);
  local_48._value = &this->markID2;
  local_48._name = "markID2";
  local_48._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_48);
  return;
}

Assistant:

void ChLinkMarkers::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChLinkMarkers>();

    // serialize parent class
    ChLink::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(markID1);
    marchive << CHNVP(markID2);
}